

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

void __thiscall CRegTestParams::CRegTestParams(CRegTestParams *this,RegTestOptions *opts)

{
  uint256 *puVar1;
  CBlock *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  int64_t *piVar2;
  pointer puVar3;
  _Hash_node_base _Var4;
  base_blob<256U> *pbVar5;
  size_type sVar6;
  bool bVar7;
  __node_base *p_Var8;
  uint64_t uVar9;
  CAmount *in_R9;
  __node_base *p_Var10;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_int,_uint256>_> __l;
  allocator_type local_13a;
  less<int> local_139;
  undefined1 local_138 [120];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 local_94;
  undefined8 uStack_8c;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  pair<const_int,_uint256> local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = REGTEST;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar3 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 0x96;
  (this->super_CChainParams).consensus.BIP34Height = 1;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar5 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[8] = '\0';
  (pbVar5->m_data)._M_elems[9] = '\0';
  (pbVar5->m_data)._M_elems[10] = '\0';
  (pbVar5->m_data)._M_elems[0xb] = '\0';
  (pbVar5->m_data)._M_elems[0xc] = '\0';
  (pbVar5->m_data)._M_elems[0xd] = '\0';
  (pbVar5->m_data)._M_elems[0xe] = '\0';
  (pbVar5->m_data)._M_elems[0xf] = '\0';
  pbVar5 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x10] = '\0';
  (pbVar5->m_data)._M_elems[0x11] = '\0';
  (pbVar5->m_data)._M_elems[0x12] = '\0';
  (pbVar5->m_data)._M_elems[0x13] = '\0';
  (pbVar5->m_data)._M_elems[0x14] = '\0';
  (pbVar5->m_data)._M_elems[0x15] = '\0';
  (pbVar5->m_data)._M_elems[0x16] = '\0';
  (pbVar5->m_data)._M_elems[0x17] = '\0';
  pbVar5 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x18] = '\0';
  (pbVar5->m_data)._M_elems[0x19] = '\0';
  (pbVar5->m_data)._M_elems[0x1a] = '\0';
  (pbVar5->m_data)._M_elems[0x1b] = '\0';
  (pbVar5->m_data)._M_elems[0x1c] = '\0';
  (pbVar5->m_data)._M_elems[0x1d] = '\0';
  (pbVar5->m_data)._M_elems[0x1e] = '\0';
  (pbVar5->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 1;
  (this->super_CChainParams).consensus.BIP66Height = 1;
  (this->super_CChainParams).consensus.CSVHeight = 1;
  (this->super_CChainParams).consensus.SegwitHeight = 0;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar5 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[4] = 0xff;
  (pbVar5->m_data)._M_elems[5] = 0xff;
  (pbVar5->m_data)._M_elems[6] = 0xff;
  (pbVar5->m_data)._M_elems[7] = 0xff;
  pbVar5 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[8] = 0xff;
  (pbVar5->m_data)._M_elems[9] = 0xff;
  (pbVar5->m_data)._M_elems[10] = 0xff;
  (pbVar5->m_data)._M_elems[0xb] = 0xff;
  pbVar5 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0xc] = 0xff;
  (pbVar5->m_data)._M_elems[0xd] = 0xff;
  (pbVar5->m_data)._M_elems[0xe] = 0xff;
  (pbVar5->m_data)._M_elems[0xf] = 0xff;
  pbVar5 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0xf] = 0xff;
  (pbVar5->m_data)._M_elems[0x10] = 0xff;
  (pbVar5->m_data)._M_elems[0x11] = 0xff;
  (pbVar5->m_data)._M_elems[0x12] = 0xff;
  pbVar5 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x13] = 0xff;
  (pbVar5->m_data)._M_elems[0x14] = 0xff;
  (pbVar5->m_data)._M_elems[0x15] = 0xff;
  (pbVar5->m_data)._M_elems[0x16] = 0xff;
  pbVar5 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x17] = 0xff;
  (pbVar5->m_data)._M_elems[0x18] = 0xff;
  (pbVar5->m_data)._M_elems[0x19] = 0xff;
  (pbVar5->m_data)._M_elems[0x1a] = 0xff;
  pbVar5 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x1b] = 0xff;
  (pbVar5->m_data)._M_elems[0x1c] = 0xff;
  (pbVar5->m_data)._M_elems[0x1d] = 0xff;
  (pbVar5->m_data)._M_elems[0x1e] = 0xff;
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x15180;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  *(undefined4 *)
   ((this->super_CChainParams).consensus.powLimit.super_base_blob<256U>.m_data._M_elems + 0x1f) =
       0x101017f;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x6c;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x90;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = 0;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = -1;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  pbVar5 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x10] = '\0';
  (pbVar5->m_data)._M_elems[0x11] = '\0';
  (pbVar5->m_data)._M_elems[0x12] = '\0';
  (pbVar5->m_data)._M_elems[0x13] = '\0';
  (pbVar5->m_data)._M_elems[0x14] = '\0';
  (pbVar5->m_data)._M_elems[0x15] = '\0';
  (pbVar5->m_data)._M_elems[0x16] = '\0';
  (pbVar5->m_data)._M_elems[0x17] = '\0';
  pbVar5 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x18] = '\0';
  (pbVar5->m_data)._M_elems[0x19] = '\0';
  (pbVar5->m_data)._M_elems[0x1a] = '\0';
  (pbVar5->m_data)._M_elems[0x1b] = '\0';
  (pbVar5->m_data)._M_elems[0x1c] = '\0';
  (pbVar5->m_data)._M_elems[0x1d] = '\0';
  (pbVar5->m_data)._M_elems[0x1e] = '\0';
  (pbVar5->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar5 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[8] = '\0';
  (pbVar5->m_data)._M_elems[9] = '\0';
  (pbVar5->m_data)._M_elems[10] = '\0';
  (pbVar5->m_data)._M_elems[0xb] = '\0';
  (pbVar5->m_data)._M_elems[0xc] = '\0';
  (pbVar5->m_data)._M_elems[0xd] = '\0';
  (pbVar5->m_data)._M_elems[0xe] = '\0';
  (pbVar5->m_data)._M_elems[0xf] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar5 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[8] = '\0';
  (pbVar5->m_data)._M_elems[9] = '\0';
  (pbVar5->m_data)._M_elems[10] = '\0';
  (pbVar5->m_data)._M_elems[0xb] = '\0';
  (pbVar5->m_data)._M_elems[0xc] = '\0';
  (pbVar5->m_data)._M_elems[0xd] = '\0';
  (pbVar5->m_data)._M_elems[0xe] = '\0';
  (pbVar5->m_data)._M_elems[0xf] = '\0';
  pbVar5 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x10] = '\0';
  (pbVar5->m_data)._M_elems[0x11] = '\0';
  (pbVar5->m_data)._M_elems[0x12] = '\0';
  (pbVar5->m_data)._M_elems[0x13] = '\0';
  (pbVar5->m_data)._M_elems[0x14] = '\0';
  (pbVar5->m_data)._M_elems[0x15] = '\0';
  (pbVar5->m_data)._M_elems[0x16] = '\0';
  (pbVar5->m_data)._M_elems[0x17] = '\0';
  pbVar5 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x18] = '\0';
  (pbVar5->m_data)._M_elems[0x19] = '\0';
  (pbVar5->m_data)._M_elems[0x1a] = '\0';
  (pbVar5->m_data)._M_elems[0x1b] = '\0';
  (pbVar5->m_data)._M_elems[0x1c] = '\0';
  (pbVar5->m_data)._M_elems[0x1d] = '\0';
  (pbVar5->m_data)._M_elems[0x1e] = '\0';
  (pbVar5->m_data)._M_elems[0x1f] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0xdab5bffa;
  (this->super_CChainParams).nDefaultPort = 0x480c;
  uVar9 = 1000;
  if (opts->fastprune != false) {
    uVar9 = 100;
  }
  (this->super_CChainParams).nPruneAfterHeight = uVar9;
  p_Var8 = &(opts->activation_heights)._M_h._M_before_begin;
  (this->super_CChainParams).m_assumed_blockchain_size = 0;
  (this->super_CChainParams).m_assumed_chain_state_size = 0;
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    switch((short)*(size_type *)(p_Var8 + 1)) {
    case -0x8000:
      (this->super_CChainParams).consensus.BIP34Height = *(int *)((long)(p_Var8 + 1) + 4);
      break;
    case -0x7fff:
      (this->super_CChainParams).consensus.BIP65Height = *(int *)((long)(p_Var8 + 1) + 4);
      break;
    case -0x7ffe:
      (this->super_CChainParams).consensus.BIP66Height = *(int *)((long)(p_Var8 + 1) + 4);
      break;
    case -0x7ffd:
      (this->super_CChainParams).consensus.CSVHeight = *(int *)((long)(p_Var8 + 1) + 4);
      break;
    case -0x7ffc:
      (this->super_CChainParams).consensus.SegwitHeight = *(int *)((long)(p_Var8 + 1) + 4);
    }
  }
  p_Var10 = &(opts->version_bits_parameters)._M_h._M_before_begin;
  while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
    sVar6 = *(size_type *)(p_Var10 + 1);
    _Var4._M_nxt = p_Var10[3]._M_nxt;
    piVar2 = &(this->super_CChainParams).consensus.vDeployments[(ushort)sVar6].nStartTime;
    *piVar2 = (int64_t)*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor;
    piVar2[1] = (int64_t)_Var4._M_nxt;
    (this->super_CChainParams).consensus.vDeployments[(ushort)sVar6].min_activation_height =
         *(int *)(p_Var10 + 4);
  }
  local_48.first = 0x2a05f200;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  local_48.second.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_48.second.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_48.second.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  CreateGenesisBlock((CBlock *)local_138,0x4d49e5da,2,0x207fffff,(int32_t)&local_48,in_R9);
  this_00 = &(this->super_CChainParams).genesis;
  CBlock::operator=(this_00,(CBlock *)local_138);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)(local_138 + 0x50));
  CBlockHeader::GetHash((uint256 *)local_138,&this_00->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) = CONCAT44(local_138._20_4_,local_138._16_4_);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) = CONCAT44(local_138._28_4_,local_138._24_4_);
  *(ulong *)(this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
            _M_elems = CONCAT44(local_138._4_4_,local_138._0_4_);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) = CONCAT44(local_138._12_4_,local_138._8_4_);
  local_138._0_4_ = 0x466e2206;
  local_138[4] = '\x11';
  local_138[5] = '\x1a';
  local_138[6] = '\v';
  local_138[7] = 'Y';
  local_138._8_4_ = 0x6012afca;
  local_138._12_4_ = 0xbf5beb43;
  local_138[0x10] = '(';
  local_138[0x11] = 0xc3;
  local_138[0x12] = 'O';
  local_138[0x13] = ':';
  local_138[0x14] = '^';
  local_138[0x15] = '3';
  local_138[0x16] = '*';
  local_138[0x17] = '\x1f';
  local_138[0x18] = 199;
  local_138[0x19] = 0xb2;
  local_138[0x1a] = 0xb7;
  local_138[0x1b] = '<';
  local_138[0x1c] = 0xf1;
  local_138[0x1d] = 0x88;
  local_138[0x1e] = 0x91;
  local_138[0x1f] = '\x0f';
  bVar7 = ::operator==((base_blob<256U> *)this,(base_blob<256U> *)local_138);
  if (!bVar7) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,600,"CRegTestParams::CRegTestParams(const RegTestOptions &)");
  }
  local_138._0_4_ = -0x2125cc5;
  local_138[4] = 'z';
  local_138[5] = '{';
  local_138[6] = '\x12';
  local_138[7] = 0xb2;
  local_138._8_4_ = 0x3e2cc77a;
  local_138._12_4_ = 0x618f7667;
  local_138[0x10] = '\x7f';
  local_138[0x11] = 200;
  local_138[0x12] = '\x1b';
  local_138[0x13] = 0xc3;
  local_138[0x14] = 0x88;
  local_138[0x15] = 0x8a;
  local_138[0x16] = 'Q';
  local_138[0x17] = '2';
  local_138[0x18] = ':';
  local_138[0x19] = 0x9f;
  local_138[0x1a] = 0xb8;
  local_138[0x1b] = 0xaa;
  local_138[0x1c] = 'K';
  local_138[0x1d] = '\x1e';
  local_138[0x1e] = '^';
  local_138[0x1f] = 'J';
  bVar7 = ::operator==(&(this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                        super_base_blob<256U>,(base_blob<256U> *)local_138);
  if (!bVar7) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x259,"CRegTestParams::CRegTestParams(const RegTestOptions &)");
  }
  puVar3 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  this_01 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_01);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[19]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [19])"dummySeed.invalid.");
  (this->super_CChainParams).fDefaultConsistencyChecks = true;
  (this->super_CChainParams).m_is_mockable_chain = true;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0xc] = 'C';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0xd] = 0xeb;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0xe] = '[';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0xf] = 0xbf;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x10] = '(';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x11] = 0xc3;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x12] = 'O';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x13] = ':';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x14] = '^';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x15] = '3';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x16] = '*';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x17] = '\x1f';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x18] = 199;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x19] = 0xb2;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xb7;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x1b] = '<';
  local_48.first = 0;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0] = '\x06';
  local_48.second.super_base_blob<256U>.m_data._M_elems[1] = '\"';
  local_48.second.super_base_blob<256U>.m_data._M_elems[2] = 'n';
  local_48.second.super_base_blob<256U>.m_data._M_elems[3] = 'F';
  local_48.second.super_base_blob<256U>.m_data._M_elems[4] = '\x11';
  local_48.second.super_base_blob<256U>.m_data._M_elems[5] = '\x1a';
  local_48.second.super_base_blob<256U>.m_data._M_elems[6] = '\v';
  local_48.second.super_base_blob<256U>.m_data._M_elems[7] = 'Y';
  local_48.second.super_base_blob<256U>.m_data._M_elems[8] = 0xca;
  local_48.second.super_base_blob<256U>.m_data._M_elems[9] = 0xaf;
  local_48.second.super_base_blob<256U>.m_data._M_elems[10] = '\x12';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0xb] = '`';
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x1c] = 0xf1;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x1d] = 0x88;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x1e] = 0x91;
  local_48.second.super_base_blob<256U>.m_data._M_elems[0x1f] = '\x0f';
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             local_138,__l,&local_139,&local_13a);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)&(this->super_CChainParams).checkpointData,
              (_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_138);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_138);
  local_138._0_4_ = 0x6e;
  local_138[4] = 0xd1;
  local_138[5] = '\t';
  local_138[6] = '\x06';
  local_138[7] = 0x83;
  local_138._8_4_ = 0x905612f1;
  local_138._12_4_ = 0x3764b1b6;
  local_138[0x10] = '\x14';
  local_138[0x11] = '\\';
  local_138[0x12] = '\x7f';
  local_138[0x13] = 0xba;
  local_138[0x14] = ']';
  local_138[0x15] = '-';
  local_138[0x16] = 0x81;
  local_138[0x17] = 0x9e;
  local_138[0x18] = 'x';
  local_138[0x19] = 0x96;
  local_138[0x1a] = 199;
  local_138[0x1b] = 0xcb;
  local_138[0x1c] = 0xb0;
  local_138[0x1d] = 'M';
  local_138[0x1e] = 0xfe;
  local_138[0x1f] = 0xd4;
  local_138[0x20] = '6';
  local_138[0x21] = 0xb7;
  local_138[0x22] = 'W';
  local_138[0x23] = 'f';
  local_138._40_8_ = 0x6f;
  local_138[0x30] = '\\';
  local_138[0x31] = 'B';
  local_138[0x32] = 'P';
  local_138[0x33] = 0xab;
  local_138[0x34] = 0xc0;
  local_138[0x35] = 0xae;
  local_138[0x36] = 0xc0;
  local_138[0x37] = 0x98;
  local_138[0x38] = 0xf2;
  local_138[0x39] = 0xd9;
  local_138[0x3a] = 'O';
  local_138[0x3b] = '<';
  local_138[0x3c] = 'z';
  local_138[0x3d] = 'd';
  local_138[0x3e] = '\x05';
  local_138[0x3f] = 'A';
  local_138[0x40] = 0xaa;
  local_138[0x41] = 0xea;
  local_138[0x42] = 0xee;
  local_138[0x43] = 0xce;
  local_138._68_4_ = 0x7ee134ed;
  local_138._72_4_ = 0x1f65549c;
  local_138._76_4_ = 0x696e9282;
  local_138._80_4_ = 200;
  local_138._84_8_ = 0x8dd7c9c1421738f2;
  local_138._92_8_ = 0x64dc8d7976d02ac6;
  local_138._100_8_ = 0xb0d67b64609ece39;
  local_138._108_8_ = 0x4f34d431c3e482f6;
  local_c0 = 0xc9;
  local_b8 = 0x37608b139ea63b27;
  uStack_b0 = 0xc3515488ad99412c;
  local_a8 = 0x5aa339d00bbf8cf1;
  uStack_a0 = 0x5e93653318f294fb;
  local_98 = 299;
  local_94 = 0x75941497d2493c27;
  uStack_8c = 0x9f8a3903daf08838;
  local_84 = 0x45c49ebba8fa9119;
  uStack_7c = 0xa4bf3407ccb2cc01;
  local_70 = 0x14e;
  local_68 = 0xca24188e6d7d96c0;
  uStack_60 = 0x6afee2c7bada3a0c;
  local_58 = 0xac1ba931;
  uStack_54 = 0x39b7a521;
  uStack_50 = 0xba0be489;
  uStack_4c = 0x3bb7ce5e;
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,local_138,&local_48);
  (this->super_CChainParams).chainTxData.dTxRate = 0.0;
  (this->super_CChainParams).chainTxData.nTime = 0;
  (this->super_CChainParams).chainTxData.tx_count = 0;
  local_48.first._0_1_ = 0x6f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,1,
             (value_type_conflict *)&local_48,(allocator_type *)&local_139);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  local_48.first._0_1_ = 0xc4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,1,
             (value_type_conflict *)&local_48,(allocator_type *)&local_139);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 1,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  local_48.first._0_1_ = 0xef;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,1,
             (value_type_conflict *)&local_48,(allocator_type *)&local_139);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 2,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  local_138._0_4_ = -0x3078cafc;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_138,local_138 + 4);
  local_138._0_4_ = -0x6b7ccafc;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4),local_138);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&(this->super_CChainParams).bech32_hrp,"bcrt");
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

explicit CRegTestParams(const RegTestOptions& opts)
    {
        m_chain_type = ChainType::REGTEST;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 150;
        consensus.BIP34Height = 1; // Always active unless overridden
        consensus.BIP34Hash = uint256();
        consensus.BIP65Height = 1;  // Always active unless overridden
        consensus.BIP66Height = 1;  // Always active unless overridden
        consensus.CSVHeight = 1;    // Always active unless overridden
        consensus.SegwitHeight = 0; // Always active unless overridden
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 24 * 60 * 60; // one day
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = true;
        consensus.fPowNoRetargeting = true;
        consensus.nRuleChangeActivationThreshold = 108; // 75% for testchains
        consensus.nMinerConfirmationWindow = 144; // Faster than normal for regtest (144 instead of 2016)

        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = 0;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{};
        consensus.defaultAssumeValid = uint256{};

        pchMessageStart[0] = 0xfa;
        pchMessageStart[1] = 0xbf;
        pchMessageStart[2] = 0xb5;
        pchMessageStart[3] = 0xda;
        nDefaultPort = 18444;
        nPruneAfterHeight = opts.fastprune ? 100 : 1000;
        m_assumed_blockchain_size = 0;
        m_assumed_chain_state_size = 0;

        for (const auto& [dep, height] : opts.activation_heights) {
            switch (dep) {
            case Consensus::BuriedDeployment::DEPLOYMENT_SEGWIT:
                consensus.SegwitHeight = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_HEIGHTINCB:
                consensus.BIP34Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_DERSIG:
                consensus.BIP66Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_CLTV:
                consensus.BIP65Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_CSV:
                consensus.CSVHeight = int{height};
                break;
            }
        }

        for (const auto& [deployment_pos, version_bits_params] : opts.version_bits_parameters) {
            consensus.vDeployments[deployment_pos].nStartTime = version_bits_params.start_time;
            consensus.vDeployments[deployment_pos].nTimeout = version_bits_params.timeout;
            consensus.vDeployments[deployment_pos].min_activation_height = version_bits_params.min_activation_height;
        }

        genesis = CreateGenesisBlock(1296688602, 2, 0x207fffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear(); //!< Regtest mode doesn't have any fixed seeds.
        vSeeds.clear();
        vSeeds.emplace_back("dummySeed.invalid.");

        fDefaultConsistencyChecks = true;
        m_is_mockable_chain = true;

        checkpointData = {
            {
                {0, uint256{"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"}},
            }
        };

        m_assumeutxo_data = {
            {   // For use by unit tests
                .height = 110,
                .hash_serialized = AssumeutxoHash{uint256{"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1"}},
                .m_chain_tx_count = 111,
                .blockhash = consteval_ctor(uint256{"696e92821f65549c7ee134edceeeeaaa4105647a3c4fd9f298c0aec0ab50425c"}),
            },
            {
                // For use by fuzz target src/test/fuzz/utxo_snapshot.cpp
                .height = 200,
                .hash_serialized = AssumeutxoHash{uint256{"4f34d431c3e482f6b0d67b64609ece3964dc8d7976d02ac68dd7c9c1421738f2"}},
                .m_chain_tx_count = 201,
                .blockhash = consteval_ctor(uint256{"5e93653318f294fb5aa339d00bbf8cf1c3515488ad99412c37608b139ea63b27"}),
            },
            {
                // For use by test/functional/feature_assumeutxo.py
                .height = 299,
                .hash_serialized = AssumeutxoHash{uint256{"a4bf3407ccb2cc0145c49ebba8fa91199f8a3903daf0883875941497d2493c27"}},
                .m_chain_tx_count = 334,
                .blockhash = consteval_ctor(uint256{"3bb7ce5eba0be48939b7a521ac1ba9316afee2c7bada3a0cca24188e6d7d96c0"}),
            },
        };

        chainTxData = ChainTxData{
            0,
            0,
            0
        };

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "bcrt";
    }